

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O0

void __thiscall
Style::Style::parseMaps
          (Style *this,xml_node<char> *def,
          vector<Style::SourceMap,_std::allocator<Style::SourceMap>_> *maps)

{
  int iVar1;
  char *__s1;
  logic_error *this_00;
  xml_node<char> *local_38;
  xml_node<char> *node;
  vector<Style::SourceMap,_std::allocator<Style::SourceMap>_> *maps_local;
  xml_node<char> *def_local;
  Style *this_local;
  
  __s1 = rapidxml::xml_base<char>::name(&def->super_xml_base<char>);
  iVar1 = strcmp(__s1,"bcf:maps");
  if (iVar1 != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unexpected node name");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  for (local_38 = rapidxml::xml_node<char>::first_node(def,(char *)0x0,0,true);
      local_38 != (xml_node<char> *)0x0;
      local_38 = rapidxml::xml_node<char>::next_sibling(local_38,(char *)0x0,0,true)) {
    parseMap(local_38,maps);
  }
  return;
}

Assistant:

void Style::parseMaps (xml_node<> *def, vector<SourceMap> &maps) {
    EXPECT_NAME(def, "bcf:maps");

    for (xml_node<> *node = def->first_node(); node; node = node->next_sibling()) {
        parseMap(node, maps);
    }
}